

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtb.cc
# Opt level: O0

ssize_t anon_unknown.dwarf_13b89::write(int __fd,void *__buf,size_t __n)

{
  int *piVar1;
  ssize_t sVar2;
  undefined4 in_register_0000003c;
  ssize_t r;
  uint8_t *data;
  size_t size;
  int fd_local;
  byte_buffer *buffer_local;
  
  data = (uint8_t *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_register_0000003c,__fd));
  piVar1 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(in_register_0000003c,__fd));
  r = (ssize_t)piVar1;
  do {
    while( true ) {
      if (data == (uint8_t *)0x0) {
        return (ssize_t)piVar1;
      }
      sVar2 = ::write((int)__buf,(void *)r,(size_t)data);
      if (sVar2 < 0) break;
      r = sVar2 + r;
      piVar1 = (int *)(data + -sVar2);
      data = (uint8_t *)piVar1;
    }
    piVar1 = __errno_location();
  } while (*piVar1 == 0xb);
  fprintf(_stderr,"Writing to file failed\n");
  exit(-1);
}

Assistant:

void write(dtc::byte_buffer &buffer, int fd)
{
	size_t size = buffer.size();
	uint8_t *data = buffer.data();
	while (size > 0)
	{
		ssize_t r = ::write(fd, data, size);
		if (r >= 0)
		{
			data += r;
			size -= r;
		}
		else if (errno != EAGAIN)
		{
			fprintf(stderr, "Writing to file failed\n");
			exit(-1);
		}
	}
}